

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

void minimalSwapAndFlipIVar_superFast_iVar5
               (uint *pInOut,int nWords,char *pCanonPerm,uint *pCanonPhase)

{
  uint *pInOut_00;
  int jQ;
  int iVar1;
  uint local_2048 [2];
  uint temp [2048];
  int M [2];
  int DifStartMin;
  int DifStart1;
  int DifStart0;
  int min2;
  int min1;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  uint *puStack_10;
  int nWords_local;
  uint *pInOut_local;
  
  _min2 = pCanonPhase;
  pCanonPhase_local = (uint *)pCanonPerm;
  pCanonPerm_local._4_4_ = nWords;
  puStack_10 = pInOut;
  temp[0x7ff] = minTemp0_fast_iVar5(pInOut,nWords,&DifStartMin);
  jQ = minTemp1_fast_iVar5(puStack_10,pCanonPerm_local._4_4_,M + 1);
  DifStart0 = minTemp2_fast_iVar5(puStack_10,temp[0x7ff],jQ,pCanonPerm_local._4_4_,M);
  pInOut_00 = puStack_10;
  if (DifStartMin == M[1]) {
    if (M[0] < DifStartMin) {
      DifStart1 = minTemp3_fast_iVar5(puStack_10,DifStartMin,M[0],3 - temp[0x7ff],3 - jQ,M + 1);
      if (M[0] < M[1]) {
        arrangeQuoters_superFast_iVar5
                  (puStack_10,local_2048,DifStartMin,temp[(long)(int)(DifStart1 + 1U & 1) + 0x7ff],
                   temp[(long)DifStart1 + 0x7ff],3 - temp[(long)DifStart1 + 0x7ff],
                   3 - temp[(long)(int)(DifStart1 + 1U & 1) + 0x7ff],(char *)pCanonPhase_local,_min2
                  );
      }
      else {
        arrangeQuoters_superFast_iVar5
                  (puStack_10,local_2048,DifStartMin,temp[(long)DifStart0 + 0x7ff],
                   temp[(long)(int)(DifStart0 + 1U & 1) + 0x7ff],
                   3 - temp[(long)(int)(DifStart0 + 1U & 1) + 0x7ff],
                   3 - temp[(long)DifStart0 + 0x7ff],(char *)pCanonPhase_local,_min2);
      }
    }
    else {
      arrangeQuoters_superFast_iVar5
                (puStack_10,local_2048,M[0],temp[(long)DifStart0 + 0x7ff],
                 temp[(long)(int)(DifStart0 + 1U & 1) + 0x7ff],
                 3 - temp[(long)(int)(DifStart0 + 1U & 1) + 0x7ff],3 - temp[(long)DifStart0 + 0x7ff]
                 ,(char *)pCanonPhase_local,_min2);
    }
  }
  else if ((M[0] < M[1]) || (M[0] < DifStartMin)) {
    if (M[1] < DifStartMin) {
      iVar1 = luckyMax(M[0],DifStartMin);
      arrangeQuoters_superFast_iVar5
                (pInOut_00,local_2048,iVar1,temp[0x7ff],jQ,3 - jQ,3 - temp[0x7ff],
                 (char *)pCanonPhase_local,_min2);
    }
    else {
      iVar1 = luckyMax(M[0],M[1]);
      arrangeQuoters_superFast_iVar5
                (pInOut_00,local_2048,iVar1,jQ,temp[0x7ff],3 - temp[0x7ff],3 - jQ,
                 (char *)pCanonPhase_local,_min2);
    }
  }
  else {
    arrangeQuoters_superFast_iVar5
              (puStack_10,local_2048,M[0],temp[(long)DifStart0 + 0x7ff],
               temp[(long)(int)(DifStart0 + 1U & 1) + 0x7ff],
               3 - temp[(long)(int)(DifStart0 + 1U & 1) + 0x7ff],3 - temp[(long)DifStart0 + 0x7ff],
               (char *)pCanonPhase_local,_min2);
  }
  return;
}

Assistant:

void minimalSwapAndFlipIVar_superFast_iVar5(unsigned* pInOut, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int min1, min2, DifStart0, DifStart1, DifStartMin;
    int M[2];
    unsigned temp[2048];
//     printf("in minimalSwapAndFlipIVar_superFast_iVar5\n");
    M[0] = minTemp0_fast_iVar5(pInOut, nWords, &DifStart0); // 0, 3
    M[1] = minTemp1_fast_iVar5(pInOut, nWords, &DifStart1); // 1, 2
    min1 = minTemp2_fast_iVar5(pInOut, M[0], M[1], nWords, &DifStartMin);
    if(DifStart0 != DifStart1)
    {   
        if( DifStartMin>=DifStart1 && DifStartMin>=DifStart0 )
            arrangeQuoters_superFast_iVar5(pInOut, temp, DifStartMin, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], pCanonPerm, pCanonPhase);
        else if( DifStart0 > DifStart1)
            arrangeQuoters_superFast_iVar5(pInOut, temp, luckyMax(DifStartMin,DifStart0), M[0], M[1], 3 - M[1], 3 - M[0], pCanonPerm, pCanonPhase);
        else
            arrangeQuoters_superFast_iVar5(pInOut, temp, luckyMax(DifStartMin,DifStart1), M[1], M[0], 3 - M[0], 3 - M[1], pCanonPerm, pCanonPhase);
    }
    else
    {
        if(DifStartMin>=DifStart0)
            arrangeQuoters_superFast_iVar5(pInOut, temp, DifStartMin, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], pCanonPerm, pCanonPhase);
        else
        {
            min2 = minTemp3_fast_iVar5(pInOut, DifStart0, DifStartMin, 3-M[0], 3-M[1], &DifStart1);  // reuse DifStart1 because DifStart1 = DifStart1=0
            if(DifStart1>DifStartMin)
                arrangeQuoters_superFast_iVar5(pInOut, temp, DifStart0, M[(min2+1)&1], M[min2], 3 - M[min2], 3 - M[(min2+1)&1], pCanonPerm, pCanonPhase);
            else
                arrangeQuoters_superFast_iVar5(pInOut, temp, DifStart0, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], pCanonPerm, pCanonPhase);
        }
    }
}